

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArgSortLayerParams::SerializeWithCachedSizes
          (ArgSortLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int64 iVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ArgSortLayerParams *this_local;
  
  iVar2 = axis(this);
  if (iVar2 != 0) {
    iVar2 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar2,output);
  }
  bVar1 = descending(this);
  if (bVar1) {
    bVar1 = descending(this);
    google::protobuf::internal::WireFormatLite::WriteBool(2,bVar1,output);
  }
  return;
}

Assistant:

void ArgSortLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ArgSortLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 axis = 1;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->axis(), output);
  }

  // bool descending = 2;
  if (this->descending() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->descending(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ArgSortLayerParams)
}